

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_A(OSQPWorkspace *work,c_float *Ax_new,c_int *Ax_new_idx,c_int A_new_n)

{
  ulong in_RCX;
  OSQPWorkspace *in_RDX;
  long in_RSI;
  long *in_RDI;
  c_float cVar1;
  c_int nnzA;
  c_int exitflag;
  c_int i;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  OSQPTimer *t;
  long local_30;
  c_int local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = _osqp_error((osqp_error_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          in_stack_ffffffffffffffb8);
  }
  else {
    if (in_RDI[0x1d] == 1) {
      in_RDI[0x1d] = 0;
      *(undefined8 *)(in_RDI[0x1a] + 0x60) = 0;
    }
    osqp_tic((OSQPTimer *)0x271aff);
    t = *(OSQPTimer **)
         (*(long *)(*(long *)(*in_RDI + 0x18) + 0x18) +
         *(long *)(*(long *)(*in_RDI + 0x18) + 0x10) * 8);
    if ((in_RDX == (OSQPWorkspace *)0x0) || ((long)in_RCX <= (long)t)) {
      if (*(long *)(in_RDI[0x17] + 0x10) != 0) {
        unscale_data((OSQPWorkspace *)0x271ba8);
      }
      if (in_RDX == (OSQPWorkspace *)0x0) {
        for (local_30 = 0; local_30 < (long)t; local_30 = local_30 + 1) {
          *(undefined8 *)(*(long *)(*(long *)(*in_RDI + 0x18) + 0x28) + local_30 * 8) =
               *(undefined8 *)(in_RSI + local_30 * 8);
        }
      }
      else {
        for (local_30 = 0; local_30 < (long)in_RCX; local_30 = local_30 + 1) {
          *(undefined8 *)
           (*(long *)(*(long *)(*in_RDI + 0x18) + 0x28) + (long)(&in_RDX->data)[local_30] * 8) =
               *(undefined8 *)(in_RSI + local_30 * 8);
        }
      }
      if (*(long *)(in_RDI[0x17] + 0x10) != 0) {
        scale_data(in_RDX);
      }
      local_8 = (**(code **)(in_RDI[1] + 0x18))
                          (in_RDI[1],*(undefined8 *)(*in_RDI + 0x10),*(undefined8 *)(*in_RDI + 0x18)
                          );
      reset_info((OSQPInfo *)0x271cbc);
      if (local_8 < 0) {
        printf("ERROR in %s: ","osqp_update_A");
        printf("new KKT matrix is not quasidefinite");
        printf("\n");
      }
      cVar1 = osqp_toc(t);
      *(double *)(in_RDI[0x1a] + 0x60) = cVar1 + *(double *)(in_RDI[0x1a] + 0x60);
    }
    else {
      printf("ERROR in %s: ","osqp_update_A");
      printf("new number of elements (%i) greater than elements in A (%i)",in_RCX & 0xffffffff,
             (ulong)t & 0xffffffff);
      printf("\n");
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

c_int osqp_update_A(OSQPWorkspace *work,
                    const c_float *Ax_new,
                    const c_int   *Ax_new_idx,
                    c_int          A_new_n) {
  c_int i;        // For indexing
  c_int exitflag; // Exit flag
  c_int nnzA;     // Number of nonzeros in A

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  nnzA = work->data->A->p[work->data->A->n];

  if (Ax_new_idx) { // Passing the index of elements changed
    // Check if number of elements is less or equal than the total number of
    // nonzeros in A
    if (A_new_n > nnzA) {
# ifdef PRINTING
      c_eprint("new number of elements (%i) greater than elements in A (%i)",
               (int)A_new_n,
               (int)nnzA);
# endif /* ifdef PRINTING */
      return 1;
    }
  }

  if (work->settings->scaling) {
    // Unscale data
    unscale_data(work);
  }

  // Update A elements
  if (Ax_new_idx) { // Change only Ax_new_idx
    for (i = 0; i < A_new_n; i++) {
      work->data->A->x[Ax_new_idx[i]] = Ax_new[i];
    }
  }
  else { // Change whole A
    for (i = 0; i < nnzA; i++) {
      work->data->A->x[i] = Ax_new[i];
    }
  }

  if (work->settings->scaling) {
    // Scale data
    scale_data(work);
  }

  // Update linear system structure with new data
  exitflag = work->linsys_solver->update_matrices(work->linsys_solver,
                                                  work->data->P,
                                                  work->data->A);

  // Reset solver information
  reset_info(work->info);

# ifdef PRINTING

  if (exitflag < 0) {
    c_eprint("new KKT matrix is not quasidefinite");
  }
# endif /* ifdef PRINTING */

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}